

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O3

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::prepareResources
          (BinaryAtomicIntermValuesInstance *this)

{
  UVec3 *imageSize;
  ImageType imageType;
  VkImage image;
  VkImageView obj;
  VkImageSubresourceRange subresourceRange;
  VkDevice pVVar1;
  Handle<(vk::HandleType)13> HVar2;
  VkAllocationCallbacks *pVVar3;
  deUint32 dVar4;
  VkImageViewType imageViewType;
  VkFormat format;
  DeviceInterface *pDVar5;
  Image *this_00;
  undefined8 uVar6;
  bool bVar7;
  UVec3 layerSize;
  undefined1 local_118 [16];
  VkDevice local_108;
  VkAllocationCallbacks *pVStack_100;
  TextureFormat *local_f0;
  VkDevice local_e8;
  Allocator *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  deUint32 local_c8;
  Move<vk::Handle<(vk::HandleType)13>_> local_b8;
  int local_94;
  deUint32 local_90;
  deUint32 local_8c;
  VkImageCreateInfo local_88;
  
  local_e8 = Context::getDevice((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context)
  ;
  pDVar5 = Context::getDeviceInterface
                     ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  local_e0 = Context::getDefaultAllocator
                       ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  imageSize = &(this->super_BinaryAtomicInstanceBase).m_imageSize;
  getLayerSize((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  imageType = (this->super_BinaryAtomicInstanceBase).m_imageType;
  bVar7 = imageType - IMAGE_TYPE_CUBE < 2;
  dVar4 = local_90 * 5;
  if (!bVar7) {
    dVar4 = local_90;
  }
  local_88.flags = (uint)bVar7 << 4;
  uVar6._4_4_ = dVar4;
  uVar6._0_4_ = local_94 * 5;
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.imageType = mapImageType(imageType);
  local_f0 = &(this->super_BinaryAtomicInstanceBase).m_format;
  local_88.format = ::vk::mapTextureFormat(local_f0);
  pVVar1 = local_e8;
  local_88.extent.depth = local_8c;
  local_88.mipLevels = 1;
  local_88.extent._0_8_ = uVar6;
  local_88.arrayLayers = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_88.usage = 9;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 0;
  local_88.pQueueFamilyIndices = (deUint32 *)0x0;
  local_88.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this_00 = (Image *)operator_new(0x30);
  Image::Image(this_00,pDVar5,pVVar1,local_e0,&local_88,(MemoryRequirement)0x0);
  local_118._0_8_ = (Image *)0x0;
  if ((this->m_intermResultsImage).
      super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr !=
      this_00) {
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
              (&(this->m_intermResultsImage).
                super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
    (this->m_intermResultsImage).
    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr = this_00
    ;
  }
  de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
            ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_118);
  dVar4 = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,imageSize);
  image.m_internal =
       (((this->m_intermResultsImage).
         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)->
       m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  imageViewType = mapImageViewType((this->super_BinaryAtomicInstanceBase).m_imageType);
  format = ::vk::mapTextureFormat(local_f0);
  local_d8 = 1;
  uStack_d0 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = dVar4;
  local_c8 = dVar4;
  makeImageView(&local_b8,pDVar5,pVVar1,image,imageViewType,format,subresourceRange);
  pVVar3 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar1 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar5 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar2.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_108 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pVStack_100 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_118._0_8_ = local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_118._8_8_ =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  if (obj.m_internal == 0) {
    (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = pVVar1;
    (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = pVVar3;
    (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
    m_internal = HVar2.m_internal;
    (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = pDVar5;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.
                m_data.deleter,obj);
    (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = local_108;
    (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = pVStack_100;
    (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
    m_internal = local_118._0_8_;
    (this->m_intermResultsImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_118._8_8_;
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  return;
}

Assistant:

void BinaryAtomicIntermValuesInstance::prepareResources (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();
	Allocator&				allocator		= m_context.getDefaultAllocator();

	const UVec3 layerSize			= getLayerSize(m_imageType, m_imageSize);
	const bool  isCubeBasedImage	= (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY);
	const UVec3 extendedLayerSize	= isCubeBasedImage	? UVec3(NUM_INVOCATIONS_PER_PIXEL * layerSize.x(), NUM_INVOCATIONS_PER_PIXEL * layerSize.y(), layerSize.z())
														: UVec3(NUM_INVOCATIONS_PER_PIXEL * layerSize.x(), layerSize.y(), layerSize.z());

	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		(m_imageType == IMAGE_TYPE_CUBE ||
		 m_imageType == IMAGE_TYPE_CUBE_ARRAY ?
		 (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT :
		 (VkImageCreateFlags)0u),					// VkImageCreateFlags		flags;
		mapImageType(m_imageType),					// VkImageType				imageType;
		mapTextureFormat(m_format),					// VkFormat					format;
		makeExtent3D(extendedLayerSize),			// VkExtent3D				extent;
		1u,											// deUint32					mipLevels;
		getNumLayers(m_imageType, m_imageSize),		// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
		VK_IMAGE_USAGE_STORAGE_BIT |
		VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
		0u,											// deUint32					queueFamilyIndexCount;
		DE_NULL,									// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout			initialLayout;
	};

	m_intermResultsImage = de::MovePtr<Image>(new Image(deviceInterface, device, allocator, imageParams, MemoryRequirement::Any));

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	m_intermResultsImageView = makeImageView(deviceInterface, device, m_intermResultsImage->get(), mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange);
}